

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

int __thiscall chrono::ChSystemDescriptor::CountActiveConstraints(ChSystemDescriptor *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChConstraint *pCVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  if (this->freeze_count != true) {
    ppCVar1 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar2 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    this->n_c = 0;
    lVar4 = (long)ppCVar2 - (long)ppCVar1;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 3;
      lVar5 = 0;
      iVar6 = 0;
      do {
        pCVar3 = ppCVar1[lVar5];
        if (pCVar3->active == true) {
          pCVar3->offset = iVar6;
          iVar6 = iVar6 + 1;
          this->n_c = iVar6;
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
  }
  return this->n_c;
}

Assistant:

int ChSystemDescriptor::CountActiveConstraints() {
    if (freeze_count)  // optimization, avoid list count all times
        return n_c;

    auto vc_size = vconstraints.size();

    n_c = 0;
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->SetOffset(n_c);  // also store offsets in state and MC matrix
            n_c++;
        }
    }
    return n_c;
}